

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O2

void _run_all<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
               (bool full,bool in_memory)

{
  bool bVar1;
  ostream *poVar2;
  logic_error *this;
  long lVar3;
  undefined8 *puVar4;
  string *psVar5;
  byte bVar6;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<unsigned_long> __l_04;
  initializer_list<unsigned_long> __l_05;
  initializer_list<unsigned_long> __l_06;
  initializer_list<unsigned_long> __l_07;
  initializer_list<unsigned_long> __l_08;
  initializer_list<unsigned_long> __l_09;
  initializer_list<unsigned_long> __l_10;
  initializer_list<unsigned_long> __l_11;
  initializer_list<unsigned_long> __l_12;
  initializer_list<unsigned_long> __l_13;
  initializer_list<unsigned_long> __l_14;
  initializer_list<unsigned_long> __l_15;
  initializer_list<unsigned_long> __l_16;
  allocator local_6cb;
  allocator_type local_6ca;
  allocator local_6c9;
  string file_content;
  string local_6a8;
  string expected_file_content;
  string local_668 [2];
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_618;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_600;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_5e8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_5d0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_5b8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_5a0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_588;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_570;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_558;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_540;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_528;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_510;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_4f8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_4e0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_4c8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_4b0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_498;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_480;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  ifstream t;
  undefined8 auStack_140 [37];
  
  bVar6 = 0;
  std::__cxx11::string::string((string *)&t,"../../test/d2.flag",(allocator *)&file_content);
  local_668[0]._M_dataplus._M_p = (pointer)0x1;
  local_668[0]._M_string_length = 1;
  __l._M_len = 2;
  __l._M_array = (iterator)local_668;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_480,__l,
             (allocator_type *)&expected_file_content);
  std::__cxx11::string::string((string *)&local_248,"",(allocator *)&local_6a8);
  compute<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            ((string *)&t,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_480,
             &local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_480);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::string((string *)&t,"../../test/a.flag",(allocator *)&file_content);
  local_668[0]._M_dataplus._M_p = (pointer)0x1;
  local_668[0]._M_string_length = 2;
  local_668[0].field_2._M_allocated_capacity = 0;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_668;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_498,__l_00,
             (allocator_type *)&expected_file_content);
  std::__cxx11::string::string((string *)&local_268,"",(allocator *)&local_6a8);
  compute<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            ((string *)&t,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_498,
             &local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_498);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::string((string *)&t,"../../test/b.flag",(allocator *)&file_content);
  local_668[0]._M_dataplus._M_p = (pointer)0x1;
  local_668[0]._M_string_length = 0;
  local_668[0].field_2._M_allocated_capacity = 0;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_668;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_4b0,__l_01,
             (allocator_type *)&expected_file_content);
  std::__cxx11::string::string((string *)&local_288,"",(allocator *)&local_6a8);
  compute<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            ((string *)&t,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_4b0,
             &local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_4b0);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::string((string *)&t,"../../test/c.flag",(allocator *)&file_content);
  local_668[0]._M_dataplus._M_p = (pointer)0x1;
  local_668[0]._M_string_length = 5;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_668;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_4c8,__l_02,
             (allocator_type *)&expected_file_content);
  std::__cxx11::string::string((string *)&local_2a8,"",(allocator *)&local_6a8);
  compute<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            ((string *)&t,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_4c8,
             &local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_4c8);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::string((string *)&t,"../../test/d.flag",(allocator *)&file_content);
  local_668[0]._M_dataplus._M_p = (pointer)0x1;
  local_668[0]._M_string_length = 0;
  local_668[0].field_2._M_allocated_capacity = 1;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)local_668;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_4e0,__l_03,
             (allocator_type *)&expected_file_content);
  std::__cxx11::string::string((string *)&local_2c8,"",(allocator *)&local_6a8);
  compute<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            ((string *)&t,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_4e0,
             &local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_4e0);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::string((string *)&t,"../../test/e.flag",(allocator *)&file_content);
  local_668[0].field_2._M_allocated_capacity = 0;
  local_668[0].field_2._8_8_ = 0;
  local_668[0]._M_dataplus._M_p = (pointer)0x1;
  local_668[0]._M_string_length = 0;
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)local_668;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_4f8,__l_04,
             (allocator_type *)&expected_file_content);
  std::__cxx11::string::string((string *)&local_2e8,"",(allocator *)&local_6a8);
  compute<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            ((string *)&t,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_4f8,
             &local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_4f8);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::string((string *)&t,"../../test/f.flag",(allocator *)&file_content);
  local_668[0]._M_dataplus._M_p = (pointer)0x1;
  local_668[0]._M_string_length = 0;
  local_668[0].field_2._M_allocated_capacity = 0;
  __l_05._M_len = 3;
  __l_05._M_array = (iterator)local_668;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_510,__l_05,
             (allocator_type *)&expected_file_content);
  std::__cxx11::string::string((string *)&local_308,"",(allocator *)&local_6a8);
  compute<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            ((string *)&t,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_510,
             &local_308);
  std::__cxx11::string::~string((string *)&local_308);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_510);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::string((string *)&t,"../../test/d3.flag",(allocator *)&file_content);
  local_668[0]._M_dataplus._M_p = (pointer)0x1;
  local_668[0]._M_string_length = 0;
  local_668[0].field_2._M_allocated_capacity = 2;
  __l_06._M_len = 3;
  __l_06._M_array = (iterator)local_668;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_528,__l_06,
             (allocator_type *)&expected_file_content);
  std::__cxx11::string::string((string *)&local_328,"",(allocator *)&local_6a8);
  compute<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            ((string *)&t,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_528,
             &local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_528);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::string((string *)&t,"../../test/d3-allzero.flag",(allocator *)&file_content)
  ;
  local_668[0]._M_dataplus._M_p = (pointer)0x1;
  local_668[0]._M_string_length = 0;
  local_668[0].field_2._M_allocated_capacity = 2;
  __l_07._M_len = 3;
  __l_07._M_array = (iterator)local_668;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_540,__l_07,
             (allocator_type *)&expected_file_content);
  std::__cxx11::string::string((string *)&local_348,"",(allocator *)&local_6a8);
  compute<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            ((string *)&t,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_540,
             &local_348);
  std::__cxx11::string::~string((string *)&local_348);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_540);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::string((string *)&t,"../../test/double-d3.flag",(allocator *)&file_content);
  local_668[0]._M_dataplus._M_p = (pointer)0x1;
  local_668[0]._M_string_length = 0;
  local_668[0].field_2._M_allocated_capacity = 5;
  __l_08._M_len = 3;
  __l_08._M_array = (iterator)local_668;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_558,__l_08,
             (allocator_type *)&expected_file_content);
  std::__cxx11::string::string((string *)&local_368,"",(allocator *)&local_6a8);
  compute<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            ((string *)&t,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_558,
             &local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_558);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::string
            ((string *)&t,"../../test/double-d3-allzero.flag",(allocator *)&file_content);
  local_668[0]._M_dataplus._M_p = (pointer)0x1;
  local_668[0]._M_string_length = 0;
  local_668[0].field_2._M_allocated_capacity = 5;
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)local_668;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_570,__l_09,
             (allocator_type *)&expected_file_content);
  std::__cxx11::string::string((string *)&local_388,"",(allocator *)&local_6a8);
  compute<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            ((string *)&t,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_570,
             &local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_570);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::string((string *)&t,"../../test/d4.flag",(allocator *)&file_content);
  local_668[0].field_2._M_allocated_capacity = 0;
  local_668[0].field_2._8_8_ = 9;
  local_668[0]._M_dataplus._M_p = (pointer)0x1;
  local_668[0]._M_string_length = 0;
  __l_10._M_len = 4;
  __l_10._M_array = (iterator)local_668;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_588,__l_10,
             (allocator_type *)&expected_file_content);
  std::__cxx11::string::string((string *)&local_3a8,"",(allocator *)&local_6a8);
  compute<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            ((string *)&t,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_588,
             &local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_588);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::string((string *)&t,"../../test/d4-allzero.flag",(allocator *)&file_content)
  ;
  local_668[0].field_2._M_allocated_capacity = 0;
  local_668[0].field_2._8_8_ = 9;
  local_668[0]._M_dataplus._M_p = (pointer)0x1;
  local_668[0]._M_string_length = 0;
  __l_11._M_len = 4;
  __l_11._M_array = (iterator)local_668;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_5a0,__l_11,
             (allocator_type *)&expected_file_content);
  std::__cxx11::string::string((string *)&local_3c8,"",(allocator *)&local_6a8);
  compute<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            ((string *)&t,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_5a0,
             &local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_5a0);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::string((string *)local_668,"../../test/d5.flag",(allocator *)&file_content);
  _t = (pointer)0x1;
  __l_12._M_len = 5;
  __l_12._M_array = (iterator)&t;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_5b8,__l_12,
             (allocator_type *)&expected_file_content);
  std::__cxx11::string::string((string *)&local_3e8,"",(allocator *)&local_6a8);
  compute<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            (local_668,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_5b8,
             &local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_5b8);
  std::__cxx11::string::~string((string *)local_668);
  std::__cxx11::string::string((string *)local_668,"../../test/d7.flag",(allocator *)&file_content);
  _t = (pointer)0x1;
  __l_13._M_len = 7;
  __l_13._M_array = (iterator)&t;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_5d0,__l_13,
             (allocator_type *)&expected_file_content);
  std::__cxx11::string::string((string *)&local_408,"",(allocator *)&local_6a8);
  compute<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            (local_668,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_5d0,
             &local_408);
  std::__cxx11::string::~string((string *)&local_408);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_5d0);
  std::__cxx11::string::~string((string *)local_668);
  if (full) {
    remove("../flagser_tmp");
    std::__cxx11::string::string((string *)&t,"../../test/a.flag",(allocator *)&file_content);
    local_668[0]._M_dataplus._M_p = (pointer)0x1;
    local_668[0]._M_string_length = 2;
    local_668[0].field_2._M_allocated_capacity = 0;
    __l_14._M_len = 3;
    __l_14._M_array = (iterator)local_668;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_5e8,__l_14,
               (allocator_type *)&expected_file_content);
    std::__cxx11::string::string((string *)&local_428,"../flagser_tmp",(allocator *)&local_6a8);
    compute<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
              ((string *)&t,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_5e8,
               &local_428);
    std::__cxx11::string::~string((string *)&local_428);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_5e8);
    std::__cxx11::string::~string((string *)&t);
    std::ifstream::ifstream(&t,"../flagser_tmp",_S_in);
    file_content._M_dataplus._M_p = (pointer)&file_content.field_2;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&file_content,*(undefined8 *)((long)auStack_140 + *(long *)(_t + -0x18)),
               0xffffffffffffffff,0,0xffffffff);
    remove("../flagser_tmp");
    std::__cxx11::string::string
              ((string *)&expected_file_content,
               "# persistence intervals in dimension 0\n [0, )\n# persistence intervals in dimension 1\n [0, )\n [0, )\n# persistence intervals in dimension 2\n\nThe remaining homology groups are trivial.\n\n# Euler characteristic: -1\n\n# Betti numbers:\n#\t\tdim H_0 = 1\n#\t\tdim H_1 = 2\n#\t\tdim H_2 = 0\n\n# Cell counts:\n#\t\tdim C_0 = 5\n#\t\tdim C_1 = 7\n#\t\tdim C_2 = 1\n#\t\tdim C_3 = 0\n"
               ,(allocator *)local_668);
    bVar1 = std::operator!=(&file_content,&expected_file_content);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"The file content differed!");
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      poVar2 = std::operator<<(poVar2,"*** EXPECTED ***");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,(string *)&expected_file_content);
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      poVar2 = std::operator<<(poVar2,"*** GOT ***");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,(string *)&file_content);
      std::endl<char,std::char_traits<char>>(poVar2);
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"The file content differed.");
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Running extensive tests, this might take a while.");
    std::endl<char,std::char_traits<char>>(poVar2);
    if (in_memory) {
      std::__cxx11::string::string
                ((string *)local_668,"../../test/medium-test-data.flag",&local_6c9);
      local_6a8.field_2._M_allocated_capacity = 0x17a;
      local_6a8.field_2._8_8_ = 0;
      local_6a8._M_dataplus._M_p = (pointer)0x379d;
      local_6a8._M_string_length = 0x9a35;
      __l_15._M_len = 4;
      __l_15._M_array = (iterator)&local_6a8;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_600,__l_15,
                 &local_6ca);
      std::__cxx11::string::string((string *)&local_448,"",&local_6cb);
      compute<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                (local_668,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_600,
                 &local_448);
      std::__cxx11::string::~string((string *)&local_448);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_600);
      std::__cxx11::string::~string((string *)local_668);
      std::__cxx11::string::string((string *)&local_6a8,"../../test/d10.flag",&local_6c9);
      puVar4 = &DAT_0014da40;
      psVar5 = local_668;
      for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
        (psVar5->_M_dataplus)._M_p = (pointer)*puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        psVar5 = (string *)((long)psVar5 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      __l_16._M_len = 10;
      __l_16._M_array = (iterator)local_668;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_618,__l_16,
                 &local_6ca);
      std::__cxx11::string::string((string *)&local_468,"",&local_6cb);
      compute<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                (&local_6a8,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_618,
                 &local_468);
      std::__cxx11::string::~string((string *)&local_468);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_618);
      std::__cxx11::string::~string((string *)&local_6a8);
    }
    std::__cxx11::string::~string((string *)&expected_file_content);
    std::__cxx11::string::~string((string *)&file_content);
    std::ifstream::~ifstream(&t);
  }
  return;
}

Assistant:

void _run_all(bool full = false, bool in_memory = false) {
	compute<dfc>("../../test/d2.flag", {{1ul, 1ul}});
	compute<dfc>("../../test/a.flag", {{1ul, 2ul, 0ul}});
	compute<dfc>("../../test/b.flag", {{1ul, 0ul, 0ul}});
	compute<dfc>("../../test/c.flag", {{1ul, 5ul}});
	compute<dfc>("../../test/d.flag", {{1ul, 0ul, 1ul}});
	compute<dfc>("../../test/e.flag", {{1ul, 0ul, 0ul, 0ul}});
	compute<dfc>("../../test/f.flag", {{1ul, 0ul, 0ul}});
	compute<dfc>("../../test/d3.flag", {{1ul, 0ul, 2ul}});
	compute<dfc>("../../test/d3-allzero.flag", {{1ul, 0ul, 2ul}});
	compute<dfc>("../../test/double-d3.flag", {{1, 0, 5}});
	compute<dfc>("../../test/double-d3-allzero.flag", {{1, 0, 5}});
	compute<dfc>("../../test/d4.flag", {{1, 0, 0, 9}});
	compute<dfc>("../../test/d4-allzero.flag", {{1, 0, 0, 9}});
	compute<dfc>("../../test/d5.flag", {{1, 0, 0, 0, 44}});
	compute<dfc>("../../test/d7.flag", {{1, 0, 0, 0, 0, 0, 1854}});

	if (full) {
		const auto file_path = "../flagser_tmp";
		std::remove(file_path);
                compute<dfc>("../../test/a.flag", {{1ul, 2ul, 0ul}}, file_path);

		// Check that the file has the right content
		std::ifstream t(file_path);
		std::string file_content((std::istreambuf_iterator<char>(t)), std::istreambuf_iterator<char>());
		std::remove(file_path);

		std::string expected_file_content =
		    "# persistence intervals in dimension 0\n [0, )\n# persistence intervals in dimension 1\n [0, )\n [0, )\n# "
		    "persistence intervals in dimension 2\n\nThe remaining homology groups are trivial.\n\n# Euler "
		    "characteristic: -1\n\n# Betti numbers:\n#\t\tdim H_0 = 1\n#\t\tdim H_1 = 2\n#\t\tdim H_2 = 0\n\n# Cell "
		    "counts:\n#\t\tdim C_0 = 5\n#\t\tdim C_1 = 7\n#\t\tdim C_2 = 1\n#\t\tdim C_3 = 0\n";

		if (file_content != expected_file_content) {
			std::cerr << "The file content differed!" << std::endl;
			std::cerr << std::endl << "*** EXPECTED ***" << std::endl << expected_file_content << std::endl;
			std::cerr << std::endl << "*** GOT ***" << std::endl << file_content << std::endl;
			throw std::logic_error("The file content differed.");
		}

#ifdef NDEBUG
		std::cout << "Running extensive tests, this might take a while." << std::endl;
		if (in_memory) {
		        compute<dfc>("../../test/medium-test-data.flag", {{14237, 39477, 378, 0}});
			compute<dfc>("../../test/d10.flag", {{1, 0, 0, 0, 0, 0, 0, 0, 0, 1334961}});
		}
#else
		std::cout << "Skipping extensive tests." << std::endl;
#endif
	}
}